

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

Array<asl::String> __thiscall asl::Array<asl::File>::with<asl::String>(Array<asl::File> *this)

{
  long *in_RSI;
  long lVar1;
  int i;
  long lVar2;
  long lVar3;
  
  Array<asl::String>::alloc((Array<asl::String> *)this,*(int *)(*in_RSI + -0x10));
  lVar3 = 8;
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(*in_RSI + -0x10); lVar2 = lVar2 + 1) {
    String::operator=((String *)((long)&this->_a->_file + lVar1),(String *)(*in_RSI + lVar3));
    lVar1 = lVar1 + 0x18;
    lVar3 = lVar3 + 0x48;
  }
  return (Array<asl::String>)(String *)this;
}

Assistant:

ASL_API Array<String> Array<File>::with<String>() const
{
	Array<String> b(length());
	for (int i = 0; i < length(); i++)
		b[i] = _a[i].path();
	return b;
}